

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

void glu::draw(RenderContext *context,deUint32 program,int numVertexArrays,
              VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback)

{
  bool bVar1;
  ContextType type;
  ApiType requiredApiType;
  ContextType ctxType;
  DrawUtilCallback *callback_local;
  PrimitiveList *primitives_local;
  VertexArrayBinding *vertexArrays_local;
  int numVertexArrays_local;
  deUint32 program_local;
  RenderContext *context_local;
  
  type.super_ApiType.m_bits = (ApiType)(*context->_vptr_RenderContext[2])();
  bVar1 = isContextTypeGLCore(type);
  if (!bVar1) {
    requiredApiType = ApiType::es(3,1);
    bVar1 = contextSupports(type,requiredApiType);
    if (!bVar1) {
      drawFromUserPointers(context,program,numVertexArrays,vertexArrays,primitives,callback);
      return;
    }
  }
  drawFromVAOBuffers(context,program,numVertexArrays,vertexArrays,primitives,callback);
  return;
}

Assistant:

void draw (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glu::ContextType ctxType = context.getType();

	if (isContextTypeGLCore(ctxType) || contextSupports(ctxType, ApiType::es(3,1)))
		drawFromVAOBuffers(context, program, numVertexArrays, vertexArrays, primitives, callback);
	else
	{
		DE_ASSERT(isContextTypeES(ctxType));
		drawFromUserPointers(context, program, numVertexArrays, vertexArrays, primitives, callback);
	}
}